

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::(anonymous_namespace)::rasterize<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *list)

{
  allocator<rr::GenericVec4> *this;
  allocator<rr::Fragment> *this_00;
  bool bVar1;
  int iVar2;
  vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_> *this_01;
  size_type sVar3;
  MultisamplePixelBufferAccess *pMVar4;
  reference point;
  __normal_iterator<const_rr::pa::Point_*,_std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>_>
  local_1b0;
  __normal_iterator<const_rr::pa::Point_*,_std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>_>
  local_1a8;
  const_iterator it;
  undefined1 local_178 [8];
  RasterizationInternalBuffers buffers;
  float *depthBufferPointer;
  undefined1 local_118 [8];
  vector<float,_std::allocator<float>_> depthValues;
  undefined1 local_f8 [8];
  vector<rr::Fragment,_std::allocator<rr::Fragment>_> shadedFragments;
  undefined1 local_d8 [8];
  vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> shaderOutputs;
  allocator<rr::FragmentPacket> local_a9;
  undefined1 local_a8 [8];
  vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> fragmentPackets;
  IVec4 renderTargetRect;
  anon_unknown_19 local_58 [8];
  IVec4 bufferRect;
  IVec4 viewportRect;
  size_t maxFragmentPackets;
  int numFragmentOutputs;
  int numSamples;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *list_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  iVar2 = RenderTarget::getNumSamples(renderTarget);
  this_01 = rr::FragmentShader::getOutputs(program->fragmentShader);
  sVar3 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::size
                    (this_01);
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)(bufferRect.m_data + 2),(state->viewport).rect.left,
             (state->viewport).rect.bottom,(state->viewport).rect.width,
             (state->viewport).rect.height);
  pMVar4 = RenderTarget::getColorBuffer(renderTarget,0);
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)(renderTargetRect.m_data + 2),pMVar4);
  anon_unknown_19::getBufferSize
            (local_58,(MultisampleConstPixelBufferAccess *)(renderTargetRect.m_data + 2));
  anon_unknown_19::rectIntersection
            ((anon_unknown_19 *)
             &fragmentPackets.
              super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(IVec4 *)(bufferRect.m_data + 2),
             (IVec4 *)local_58);
  std::allocator<rr::FragmentPacket>::allocator(&local_a9);
  std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::vector
            ((vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> *)local_a8,0x80,
             &local_a9);
  std::allocator<rr::FragmentPacket>::~allocator(&local_a9);
  this = (allocator<rr::GenericVec4> *)
         ((long)&shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<rr::GenericVec4>::allocator(this);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            ((vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)local_d8,
             (long)(int)sVar3 << 9,this);
  std::allocator<rr::GenericVec4>::~allocator
            ((allocator<rr::GenericVec4> *)
             ((long)&shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_00 = (allocator<rr::Fragment> *)
            ((long)&depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<rr::Fragment>::allocator(this_00);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::vector
            ((vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)local_f8,0x200,this_00);
  std::allocator<rr::Fragment>::~allocator
            ((allocator<rr::Fragment> *)
             ((long)&depthValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<float>::allocator((allocator<float> *)((long)&depthBufferPointer + 7));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_118,0,
             (allocator<float> *)((long)&depthBufferPointer + 7));
  std::allocator<float>::~allocator((allocator<float> *)((long)&depthBufferPointer + 7));
  buffers.fragmentDepthBuffer = (float *)0x0;
  anon_unknown_19::RasterizationInternalBuffers::RasterizationInternalBuffers
            ((RasterizationInternalBuffers *)local_178);
  pMVar4 = RenderTarget::getDepthBuffer(renderTarget);
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&it,pMVar4);
  bVar1 = anon_unknown_19::isEmpty((MultisampleConstPixelBufferAccess *)&it);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_118,(long)iVar2 << 9);
    buffers.fragmentDepthBuffer =
         std::vector<float,_std::allocator<float>_>::operator[]
                   ((vector<float,_std::allocator<float>_> *)local_118,0);
  }
  std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::swap
            ((vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> *)local_178,
             (vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> *)local_a8);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::swap
            ((vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)
             &buffers.fragmentPackets.
              super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)local_d8);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::swap
            ((vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)
             &buffers.shaderOutputs.
              super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)local_f8);
  buffers.shadedFragments.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)buffers.fragmentDepthBuffer;
  local_1a8._M_current =
       (Point *)std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::begin(list);
  while( true ) {
    local_1b0._M_current =
         (Point *)std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::end(list);
    bVar1 = __gnu_cxx::operator!=(&local_1a8,&local_1b0);
    if (!bVar1) break;
    point = __gnu_cxx::
            __normal_iterator<const_rr::pa::Point_*,_std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>_>
            ::operator*(&local_1a8);
    anon_unknown_19::rasterizePrimitive
              (state,renderTarget,program,point,
               (IVec4 *)&fragmentPackets.
                         super__Vector_base<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (RasterizationInternalBuffers *)local_178);
    __gnu_cxx::
    __normal_iterator<const_rr::pa::Point_*,_std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>_>
    ::operator++(&local_1a8);
  }
  anon_unknown_19::RasterizationInternalBuffers::~RasterizationInternalBuffers
            ((RasterizationInternalBuffers *)local_178);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_118);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::~vector
            ((vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)local_f8);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::~vector
            ((vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)local_d8);
  std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::~vector
            ((vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_> *)local_a8);
  return;
}

Assistant:

void rasterize (const RenderState&					state,
				const RenderTarget&					renderTarget,
				const Program&						program,
				const ContainerType&				list)
{
	const int						numSamples			= renderTarget.getNumSamples();
	const int						numFragmentOutputs	= (int)program.fragmentShader->getOutputs().size();
	const size_t					maxFragmentPackets	= 128;

	const tcu::IVec4				viewportRect		= tcu::IVec4(state.viewport.rect.left, state.viewport.rect.bottom, state.viewport.rect.width, state.viewport.rect.height);
	const tcu::IVec4				bufferRect			= getBufferSize(renderTarget.getColorBuffer(0));
	const tcu::IVec4				renderTargetRect	= rectIntersection(viewportRect, bufferRect);

	// shared buffers for all primitives
	std::vector<FragmentPacket>		fragmentPackets		(maxFragmentPackets);
	std::vector<GenericVec4>		shaderOutputs		(maxFragmentPackets*4*numFragmentOutputs);
	std::vector<Fragment>			shadedFragments		(maxFragmentPackets*4);
	std::vector<float>				depthValues			(0);
	float*							depthBufferPointer	= DE_NULL;

	RasterizationInternalBuffers	buffers;

	// calculate depth only if we have a depth buffer
	if (!isEmpty(renderTarget.getDepthBuffer()))
	{
		depthValues.resize(maxFragmentPackets*4*numSamples);
		depthBufferPointer = &depthValues[0];
	}

	// set buffers
	buffers.fragmentPackets.swap(fragmentPackets);
	buffers.shaderOutputs.swap(shaderOutputs);
	buffers.shadedFragments.swap(shadedFragments);
	buffers.fragmentDepthBuffer = depthBufferPointer;

	// rasterize
	for (typename ContainerType::const_iterator it = list.begin(); it != list.end(); ++it)
		rasterizePrimitive(state, renderTarget, program, *it, renderTargetRect, buffers);
}